

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,QList<int> *path)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  QRect QVar5;
  
  uVar3 = 0xffffffff00000000;
  uVar4 = 0xffffffff;
  this_00 = info(this,path);
  index = (path->d).ptr[(path->d).size + -1];
  if (((long)index < 0) || ((ulong)(this_00->item_list).d.size <= (ulong)(long)index)) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    QVar5 = QDockAreaLayoutInfo::itemRect(this_00,index,true);
    uVar2 = (ulong)(uint)QVar5.x1.m_i.m_i;
    uVar1 = QVar5._0_8_ & 0xffffffff00000000;
    uVar3 = QVar5._8_8_ & 0xffffffff00000000;
    uVar4 = (ulong)(uint)QVar5.x2.m_i.m_i;
  }
  QVar5._0_8_ = uVar1 | uVar2;
  QVar5.x2.m_i = (int)(uVar3 | uVar4);
  QVar5.y2.m_i = (int)((uVar3 | uVar4) >> 0x20);
  return QVar5;
}

Assistant:

QRect QDockAreaLayout::gapRect(const QList<int> &path) const
{
    const QDockAreaLayoutInfo *info = this->info(path);
    if (info == nullptr)
        return QRect();
    int index = path.last();
    if (index < 0 || index >= info->item_list.size())
        return QRect();
    return info->itemRect(index, true);
}